

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MultiIterFree(Fts5Iter *pIter)

{
  Fts5Buffer *pBuf;
  long lVar1;
  
  if (pIter != (Fts5Iter *)0x0) {
    pBuf = &pIter->aSeg[0].term;
    for (lVar1 = 0; lVar1 < pIter->nSeg; lVar1 = lVar1 + 1) {
      sqlite3Fts5BufferFree(pBuf);
      sqlite3_free(*(void **)&pBuf[-5].n);
      sqlite3_free(pBuf[-4].p);
      fts5DlidxIterFree(*(Fts5DlidxIter **)&pBuf[-1].n);
      sqlite3_free(pBuf[-1].p);
      pBuf->n = 0;
      pBuf->nSpace = 0;
      pBuf[1].p = (u8 *)0x0;
      pBuf[-1].n = 0;
      pBuf[-1].nSpace = 0;
      pBuf->p = (u8 *)0x0;
      pBuf[-2].n = 0;
      pBuf[-2].nSpace = 0;
      pBuf[-1].p = (u8 *)0x0;
      pBuf[-3].n = 0;
      pBuf[-3].nSpace = 0;
      pBuf[-2].p = (u8 *)0x0;
      pBuf[-4].n = 0;
      pBuf[-4].nSpace = 0;
      pBuf[-3].p = (u8 *)0x0;
      pBuf[1].n = 0;
      pBuf[1].nSpace = 0;
      pBuf[-5].n = 0;
      pBuf[-5].nSpace = 0;
      pBuf[-4].p = (u8 *)0x0;
      pBuf[-6].n = 0;
      pBuf[-6].nSpace = 0;
      pBuf[-5].p = (u8 *)0x0;
      pBuf = (Fts5Buffer *)&pBuf[7].n;
    }
    sqlite3Fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
    return;
  }
  return;
}

Assistant:

static void fts5MultiIterFree(Fts5Iter *pIter){
  if( pIter ){
    int i;
    for(i=0; i<pIter->nSeg; i++){
      fts5SegIterClear(&pIter->aSeg[i]);
    }
    fts5BufferFree(&pIter->poslist);
    sqlite3_free(pIter);
  }
}